

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O2

XmlRpcValue __thiscall miniros::Publication::getStats(Publication *this)

{
  long lVar1;
  Publication *pPVar2;
  XmlRpcValue *pXVar3;
  anon_union_8_8_d5adaace_for__value extraout_RDX;
  int i;
  string *in_RSI;
  long *plVar4;
  XmlRpcValue XVar5;
  int local_54;
  pthread_mutex_t *local_50;
  Publication *local_48;
  XmlRpcValue conn_data;
  
  *(undefined4 *)&(this->name_)._M_dataplus._M_p = 0;
  (this->name_)._M_string_length = 0;
  XmlRpc::XmlRpcValue::XmlRpcValue(&conn_data,in_RSI);
  pXVar3 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,0);
  XmlRpc::XmlRpcValue::operator=(pXVar3,&conn_data);
  XmlRpc::XmlRpcValue::~XmlRpcValue(&conn_data);
  conn_data._type = TypeInvalid;
  conn_data._value.asDouble = 0.0;
  XmlRpc::XmlRpcValue::assertArray(&conn_data,0);
  local_50 = (pthread_mutex_t *)&in_RSI[8].field_2;
  local_48 = this;
  std::mutex::lock((mutex *)&local_50->__data);
  i = 0;
  for (plVar4 = *(long **)((long)&in_RSI[7].field_2 + 8); pPVar2 = local_48,
      plVar4 != (long *)in_RSI[8]._M_dataplus._M_p; plVar4 = plVar4 + 2) {
    lVar1 = *plVar4;
    local_54 = *(int *)(lVar1 + 0x28);
    pXVar3 = XmlRpc::XmlRpcValue::operator[](&conn_data,i);
    pXVar3 = XmlRpc::XmlRpcValue::operator[](pXVar3,0);
    XmlRpc::XmlRpcValue::operator=(pXVar3,&local_54);
    local_54 = *(int *)(lVar1 + 0x50);
    pXVar3 = XmlRpc::XmlRpcValue::operator[](&conn_data,i);
    pXVar3 = XmlRpc::XmlRpcValue::operator[](pXVar3,1);
    XmlRpc::XmlRpcValue::operator=(pXVar3,&local_54);
    local_54 = *(int *)(lVar1 + 0x58);
    pXVar3 = XmlRpc::XmlRpcValue::operator[](&conn_data,i);
    pXVar3 = XmlRpc::XmlRpcValue::operator[](pXVar3,2);
    XmlRpc::XmlRpcValue::operator=(pXVar3,&local_54);
    local_54 = *(int *)(lVar1 + 0x60);
    pXVar3 = XmlRpc::XmlRpcValue::operator[](&conn_data,i);
    pXVar3 = XmlRpc::XmlRpcValue::operator[](pXVar3,3);
    XmlRpc::XmlRpcValue::operator=(pXVar3,&local_54);
    local_54 = 0;
    pXVar3 = XmlRpc::XmlRpcValue::operator[](&conn_data,i);
    pXVar3 = XmlRpc::XmlRpcValue::operator[](pXVar3,4);
    XmlRpc::XmlRpcValue::operator=(pXVar3,&local_54);
    i = i + 1;
  }
  pXVar3 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)local_48,1);
  XmlRpc::XmlRpcValue::operator=(pXVar3,&conn_data);
  pthread_mutex_unlock(local_50);
  XmlRpc::XmlRpcValue::~XmlRpcValue(&conn_data);
  XVar5._value.asDouble = extraout_RDX.asDouble;
  XVar5._0_8_ = pPVar2;
  return XVar5;
}

Assistant:

XmlRpc::XmlRpcValue Publication::getStats()
{
  XmlRpc::XmlRpcValue stats;
  stats[0] = name_;
  XmlRpc::XmlRpcValue conn_data;
  conn_data.setSize(0); // force to be an array, even if it's empty

  std::scoped_lock<std::mutex> lock(subscriber_links_mutex_);

  uint32_t cidx = 0;
  for (V_SubscriberLink::iterator c = subscriber_links_.begin();
       c != subscriber_links_.end(); ++c, cidx++)
  {
    const SubscriberLink::Stats& s = (*c)->getStats();
    conn_data[cidx][0] = (*c)->getConnectionID();
    // todo: figure out what to do here... the bytes_sent will wrap around
    // on some flows within a reasonable amount of time. xmlrpc++ doesn't
    // seem to give me a nice way to do 64-bit ints, perhaps that's a
    // limitation of xml-rpc, not sure. alternatively we could send the number
    // of KB transmitted to gain a few order of magnitude.
    conn_data[cidx][1] = (int)s.bytes_sent_;
    conn_data[cidx][2] = (int)s.message_data_sent_;
    conn_data[cidx][3] = (int)s.messages_sent_;
    conn_data[cidx][4] = 0; // not sure what is meant by connected
  }

  stats[1] = conn_data;
  return stats;
}